

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O3

int __thiscall QVariant::typeId(QVariant *this)

{
  int iVar1;
  QMetaTypeInterface *pQVar2;
  
  pQVar2 = (QMetaTypeInterface *)QVariant::metaType();
  if (pQVar2 == (QMetaTypeInterface *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = (pQVar2->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar1 == 0) {
      iVar1 = QMetaType::registerHelper(pQVar2);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int typeId() const { return metaType().id(); }